

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::EmptyCore::waitCommand_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,EmptyCore *this,LocalFederateId param_1)

{
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> EmptyCore::waitCommand(LocalFederateId /*federateID*/)
{
    return {};
}